

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall testing::TestSuite::failed_test_count(TestSuite *this)

{
  int iVar1;
  
  iVar1 = internal::
          CountIf<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,bool(*)(testing::TestInfo_const*)>
                    (&this->test_info_list_,TestFailed);
  return iVar1;
}

Assistant:

int TestSuite::failed_test_count() const {
  return CountIf(test_info_list_, TestFailed);
}